

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O1

QByteArray * __thiscall
QMetaMethod::parameterTypeName(QByteArray *__return_storage_ptr__,QMetaMethod *this,int index)

{
  uint typeId;
  QMetaObject *pQVar1;
  uint *puVar2;
  long lVar3;
  ulong uVar4;
  ulong size;
  char *data;
  long in_FS_OFFSET;
  QMetaType local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->mobj;
  if ((index < 0 || pQVar1 == (QMetaObject *)0x0) || ((int)(this->data).d[1] <= index)) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_00285bf7;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    typeId = (pQVar1->d).data[(int)((this->data).d[2] + index + 1)];
    if ((int)typeId < 0) {
      puVar2 = (pQVar1->d).stringdata;
      size = (ulong)puVar2[(int)(typeId * 2 + 1)];
      data = (char *)((ulong)puVar2[(int)(typeId * 2)] + (long)puVar2);
    }
    else {
      QMetaType::QMetaType(&local_20,typeId);
      if (local_20.d_ptr == (QMetaTypeInterface *)0x0) {
        data = (char *)0x0;
      }
      else {
        data = (local_20.d_ptr)->name;
      }
      if (data == (char *)0x0) {
        size = 0;
      }
      else {
        uVar4 = 0xffffffffffffffff;
        do {
          size = uVar4 + 1;
          lVar3 = uVar4 + 1;
          uVar4 = size;
        } while (data[lVar3] != '\0');
      }
    }
    if (((pQVar1->d).data[0xc] & 8) == 0) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = data;
      (__return_storage_ptr__->d).size = size;
    }
    else {
      QByteArray::QByteArray(__return_storage_ptr__,data,size);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
LAB_00285bf7:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QMetaMethod::parameterTypeName(int index) const
{
    if (!mobj || index < 0 || index >= parameterCount())
        return {};
    // ### Qt 7: change the return type and make noexcept
    return stringData(mobj, QMetaMethodPrivate::get(this)->parameterTypeName(index));
}